

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

int adj_lev(d_level *dlev,permonst *ptr)

{
  char cVar1;
  xchar xVar2;
  int iVar3;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  int tmp2;
  int tmp;
  permonst *ptr_local;
  d_level *dlev_local;
  
  if (ptr == mons + 0x128) {
    local_24 = mvitals[0x128].died + 0x1e;
    if (0x31 < local_24) {
      local_24 = 0x31;
    }
    dlev_local._4_4_ = local_24;
  }
  else if (ptr->mlevel < '2') {
    cVar1 = ptr->mlevel;
    xVar2 = level_difficulty(dlev);
    iVar3 = (int)xVar2 - (int)ptr->mlevel;
    if (iVar3 < 0) {
      local_24 = (int)cVar1 - 1;
    }
    else {
      local_24 = iVar3 / 5 + (int)cVar1;
    }
    local_28 = (ptr->mlevel * 3) / 2;
    if (0x31 < (int)local_28) {
      local_28 = 0x31;
    }
    if ((int)local_28 < (int)local_24) {
      local_2c = local_28;
    }
    else {
      if ((int)local_24 < 1) {
        local_30 = 0;
      }
      else {
        local_30 = local_24;
      }
      local_2c = local_30;
    }
    dlev_local._4_4_ = local_2c;
  }
  else {
    dlev_local._4_4_ = 0x32;
  }
  return dlev_local._4_4_;
}

Assistant:

int adj_lev(const d_level *dlev, const struct permonst *ptr)
{
	int	tmp, tmp2;

	if (ptr == &mons[PM_WIZARD_OF_YENDOR]) {
		/* does not depend on other strengths, but does get stronger
		 * every time he is killed
		 */
		tmp = ptr->mlevel + mvitals[PM_WIZARD_OF_YENDOR].died;
		if (tmp > 49) tmp = 49;
		return tmp;
	}

	if (ptr->mlevel > 49) return 50; /* "special" demons/devils */
	tmp = ptr->mlevel;
	tmp2 = level_difficulty(dlev) - ptr->mlevel;
	if (tmp2 < 0) tmp--;		/* if mlevel > u.uz decrement tmp */
	else tmp += (tmp2 / 5);		/* else increment 1 per five diff */

	tmp2 = (3 * ptr->mlevel)/ 2;	/* crude upper limit */
	if (tmp2 > 49) tmp2 = 49;		/* hard upper limit */
	return (tmp > tmp2) ? tmp2 : (tmp > 0 ? tmp : 0); /* 0 lower limit */
}